

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O1

void __thiscall AllFloatsWriteTest::RunShard(AllFloatsWriteTest *this,int shard)

{
  undefined4 in_register_00000034;
  ulong uVar1;
  char *message;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint32_t them_bits;
  AssertionResult gtest_ar;
  char *endptr;
  char buffer [100];
  uint local_cc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  float local_bc;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  char *local_a0;
  char local_98 [104];
  
  uVar1 = CONCAT44(in_register_00000034,shard);
  uVar2 = 0xffffffff;
  local_cc = shard;
  do {
    if ((shard == 0) && (uVar3 = (uint)(uVar1 >> 0x18) & 0xff, uVar3 != uVar2)) {
      printf("value: 0x%08x (%d%%)\r",uVar1,
             (ulong)(uint)(int)(((double)(uVar1 & 0xffffffff) * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar2 = uVar3;
    }
    if ((~local_cc & 0x7f800000) != 0) {
      wabt::WriteFloatHex(local_98,100,local_cc);
      local_bc = strtof(local_98,&local_a0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_b8,"bits","them_bits",&local_cc,(uint *)&local_bc);
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        if (local_b0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_b0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,0x87,message);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_c8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_c8.ptr_ + 8))();
          }
          local_c8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar3 = (this->super_ThreadedTest).num_threads_;
    bVar4 = CARRY4(uVar3,local_cc);
    local_cc = uVar3 + local_cc;
    uVar1 = (ulong)local_cc;
  } while (!bVar4);
  if (shard == 0) {
    puts("done.");
    fflush(_stdout);
  }
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      WriteFloatHex(buffer, sizeof(buffer), bits);

      char* endptr;
      float them_float = strtof(buffer, &endptr);
      uint32_t them_bits = bit_cast<uint32_t>(them_float);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }